

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::InputSimpleForces
          (ChLoadContactSurfaceMesh *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_forces,
          vector<int,_std::allocator<int>_> *vert_ind)

{
  pointer pCVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode;
  shared_ptr<chrono::ChLoadXYZnode> mforce;
  vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
  trilist;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ind_ptr_map;
  map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
  ptr_ind_map;
  
  if (((long)(vert_forces->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vert_forces->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
      (long)(vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    std::
    vector<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
    ::clear(&this->forces);
    std::
    vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
    ::vector(&trilist,&((this->contactmesh).
                        super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->vfaces);
    ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header;
    lVar4 = 0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ind_ptr_map.
    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ind_ptr_map.
    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ind_ptr_map.
    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ptr_ind_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)trilist.
                              super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)trilist.
                              super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)((long)&((trilist.
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar4) + 0x30));
      mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar2 = std::
              map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
              ::count(&ptr_ind_map,(key_type *)&mforce);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (sVar2 == 0) {
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&mforce,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x30));
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var5;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&ptr_ind_map,
                   (pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x30));
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
        ::emplace_back<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>
                  ((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
                    *)&ind_ptr_map,
                   (shared_ptr<chrono::fea::ChNodeFEAxyz> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var5->_vptr__Sp_counted_base + 1);
      }
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)((long)&((trilist.
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar4) + 0x40));
      mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar2 = std::
              map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
              ::count(&ptr_ind_map,(key_type *)&mforce);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (sVar2 == 0) {
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&mforce,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x40));
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var5;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&ptr_ind_map,
                   (pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x40));
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
        ::emplace_back<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>
                  ((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
                    *)&ind_ptr_map,
                   (shared_ptr<chrono::fea::ChNodeFEAxyz> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var5->_vptr__Sp_counted_base + 1);
      }
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)((long)&((trilist.
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar4) + 0x50));
      mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar2 = std::
              map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
              ::count(&ptr_ind_map,(key_type *)&mforce);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (sVar2 == 0) {
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&mforce,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x50));
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var5;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&ptr_ind_map,
                   (pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)&((trilist.
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x50));
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
        ::emplace_back<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>
                  ((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>>>
                    *)&ind_ptr_map,
                   (shared_ptr<chrono::fea::ChNodeFEAxyz> *)
                   &mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var5->_vptr__Sp_counted_base + 1);
      }
      lVar4 = lVar4 + 0x10;
    }
    lVar4 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(vert_forces->
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(vert_forces->
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1
        ) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
                 &ind_ptr_map.
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [(vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar3]].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
      std::make_shared<chrono::ChLoadXYZnode,std::shared_ptr<chrono::fea::ChNodeFEAxyz>&>
                ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)&mforce);
      pCVar1 = (vert_forces->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ChVector<double> *)((long)pCVar1->m_data + lVar4) !=
          &((mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_ChLoad<chrono::ChLoaderXYZnode>).loader.force) {
        ((mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChLoad<chrono::ChLoaderXYZnode>).loader.force.m_data[0] =
             *(double *)((long)pCVar1->m_data + lVar4);
        ((mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChLoad<chrono::ChLoaderXYZnode>).loader.force.m_data[1] =
             *(double *)((long)pCVar1->m_data + lVar4 + 8);
        ((mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChLoad<chrono::ChLoaderXYZnode>).loader.force.m_data[2] =
             *(double *)((long)pCVar1->m_data + lVar4 + 0x10);
      }
      std::
      vector<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
      ::push_back(&this->forces,&mforce);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mforce.super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      lVar4 = lVar4 + 0x18;
    }
    ChSystem::ForceUpdate
              ((((((this->contactmesh).
                   super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_ChContactSurface).m_mesh)->super_ChIndexedNodes).
               super_ChPhysicsItem.system);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ::~vector(&ind_ptr_map);
    std::
    _Rb_tree<chrono::fea::ChNodeFEAxyz_*,_std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>,_std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&ptr_ind_map._M_t);
    std::
    vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
    ::~vector(&trilist);
    return;
  }
  __assert_fail("vert_forces.size() == vert_ind.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChLoadContactSurfaceMesh.cpp"
                ,0x40,
                "void chrono::fea::ChLoadContactSurfaceMesh::InputSimpleForces(const std::vector<ChVector<>>, const std::vector<int>)"
               );
}

Assistant:

void ChLoadContactSurfaceMesh::InputSimpleForces(const std::vector<ChVector<>> vert_forces,
                                                 const std::vector<int> vert_ind) {
    // check the vert_forces and vert_ind arrays must have same size:
    assert(vert_forces.size() == vert_ind.size());
    // reset the previously applied forces if any:
    this->forces.clear();

    // prepare auxiliary map container to go from index-based mesh to pointer-based mesh:
    size_t vertex_index = 0;
    auto trilist = this->contactmesh->GetTriangleList();
    std::map<ChNodeFEAxyz*, size_t> ptr_ind_map;
    std::vector<std::shared_ptr<ChNodeFEAxyz>> ind_ptr_map;
    for (size_t i = 0; i < trilist.size(); ++i) {
        if (!ptr_ind_map.count(trilist[i]->GetNode1().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode1().get(), vertex_index});
            ind_ptr_map.push_back(trilist[i]->GetNode1());
            ++vertex_index;
        }
        if (!ptr_ind_map.count(trilist[i]->GetNode2().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode2().get(), vertex_index});
            ind_ptr_map.push_back(trilist[i]->GetNode2());
            ++vertex_index;
        }
        if (!ptr_ind_map.count(trilist[i]->GetNode3().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode3().get(), vertex_index});
            ind_ptr_map.push_back(trilist[i]->GetNode3());
            ++vertex_index;
        }
    }
    // Populate the array of applied loads to nodes
    for (size_t i = 0; i < vert_forces.size(); ++i) {
        std::shared_ptr<ChNodeFEAxyz> mnode = ind_ptr_map[vert_ind[i]];
        auto mforce = chrono_types::make_shared<ChLoadXYZnode>(mnode);
        mforce->loader.SetForce(vert_forces[i]);
        this->forces.push_back(mforce);
    }

    // Force an update of the system containing the associated mesh
    contactmesh->GetMesh()->GetSystem()->ForceUpdate();
}